

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O2

bool __thiscall
SigningProvider::GetKeyOriginByXOnly(SigningProvider *this,XOnlyPubKey *pubkey,KeyOriginInfo *info)

{
  int iVar1;
  pointer pCVar2;
  CKeyID *id;
  long in_FS_OFFSET;
  _Vector_base<CKeyID,_std::allocator<CKeyID>_> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetKeyIDs((vector<CKeyID,_std::allocator<CKeyID>_> *)&local_40,pubkey);
  do {
    pCVar2 = local_40._M_impl.super__Vector_impl_data._M_start;
    if (pCVar2 == local_40._M_impl.super__Vector_impl_data._M_finish) break;
    iVar1 = (*this->_vptr_SigningProvider[7])(this,pCVar2,info);
    local_40._M_impl.super__Vector_impl_data._M_start = pCVar2 + 1;
  } while ((char)iVar1 == '\0');
  std::_Vector_base<CKeyID,_std::allocator<CKeyID>_>::~_Vector_base(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar2 != local_40._M_impl.super__Vector_impl_data._M_finish;
  }
  __stack_chk_fail();
}

Assistant:

bool GetKeyOriginByXOnly(const XOnlyPubKey& pubkey, KeyOriginInfo& info) const
    {
        for (const auto& id : pubkey.GetKeyIDs()) {
            if (GetKeyOrigin(id, info)) return true;
        }
        return false;
    }